

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clip.cpp
# Opt level: O0

int get_deepest_feature_layer(clip_ctx *ctx)

{
  bool bVar1;
  reference pvVar2;
  long in_RDI;
  value_type_conflict1 *feature_layer;
  const_iterator __end1;
  const_iterator __begin1;
  unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *__range1;
  int deepest_feature_layer;
  int n_layer;
  clip_hparams *hparams;
  unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>
  *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  _Node_iterator_base<int,_false> local_30;
  _Node_iterator_base<int,_false> local_28;
  long local_20;
  value_type_conflict1 local_18;
  int local_14;
  long local_10;
  
  local_10 = in_RDI + 0x10;
  local_18 = -1;
  if ((((*(byte *)(in_RDI + 3) & 1) != 0) || ((*(byte *)(in_RDI + 4) & 1) != 0)) ||
     (local_14 = *(int *)(in_RDI + 0x28) + -1, (*(byte *)(in_RDI + 5) & 1) != 0)) {
    local_14 = *(int *)(in_RDI + 0x28);
  }
  local_20 = in_RDI + 0x60;
  local_28._M_cur =
       (__node_type *)
       std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::begin
                 (in_stack_ffffffffffffffb8);
  local_30._M_cur =
       (__node_type *)
       std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::end
                 (in_stack_ffffffffffffffb8);
  while (bVar1 = std::__detail::operator!=(&local_28,&local_30), bVar1) {
    pvVar2 = std::__detail::_Node_const_iterator<int,_true,_false>::operator*
                       ((_Node_const_iterator<int,_true,_false> *)0x165895);
    if (local_18 < *pvVar2) {
      local_18 = *pvVar2;
    }
    std::__detail::_Node_const_iterator<int,_true,_false>::operator++
              ((_Node_const_iterator<int,_true,_false> *)
               CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  }
  if (local_18 < 0) {
    local_18 = local_14;
  }
  return local_18;
}

Assistant:

int get_deepest_feature_layer(const struct clip_ctx * ctx) {
    // Get the index of the second to last layer; this is the
    // default for models that have a llava projector
    const auto & hparams = ctx->vision_model.hparams;
    int n_layer = hparams.n_layer - 1;
    int deepest_feature_layer = -1;

    // Handle other projectors; incrementing here indicates that we
    // should use the last encoder layer for the vision features.
    if (ctx->has_minicpmv_projector || ctx->has_glm_projector || ctx->has_qwen2vl_merger) {
        n_layer += 1;
    }

    // If we set explicit vision feature layers, only go up to the deepest one
    for (const auto & feature_layer : hparams.vision_feature_layer) {
        if (feature_layer > deepest_feature_layer) {
            deepest_feature_layer = feature_layer;
        }
    }
    return deepest_feature_layer < 0 ? n_layer : deepest_feature_layer;
}